

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_in.c
# Opt level: O1

void ReadImage(gdImagePtr im,gdIOCtx *fd,int len,int height,uchar (*cmap) [256],int interlace,
              int *ZeroDataBlockP)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  int x;
  uint uVar5;
  uchar c;
  LZW_STATIC_DATA sd;
  byte bStack_10191;
  int iStack_10190;
  int iStack_1018c;
  LZW_STATIC_DATA LStack_10188;
  
  iStack_10190 = interlace;
  iStack_1018c = len;
  iVar1 = gdGetBuf(&bStack_10191,1,fd);
  if (bStack_10191 < 0xd && 0 < iVar1) {
    lVar3 = 0x200;
    do {
      *(uint *)((long)im + lVar3 * 4 + -0x7ec) = (uint)cmap[-2][lVar3];
      *(uint *)((long)im + lVar3 * 4 + -0x3ec) = (uint)cmap[-1][lVar3];
      im->red[lVar3] = (uint)(*cmap)[lVar3];
      im->green[lVar3] = 1;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x300);
    im->colorsTotal = 0x100;
    iVar1 = LWZReadByte(fd,&LStack_10188,'\x01',(uint)bStack_10191,ZeroDataBlockP);
    if (-1 < iVar1) {
      x = 0;
      iVar1 = 0;
      uVar5 = 0;
      do {
        uVar2 = LWZReadByte(fd,&LStack_10188,'\0',(uint)bStack_10191,ZeroDataBlockP);
        if ((int)uVar2 < 0) break;
        uVar4 = (ulong)uVar2;
        if (0xff < (int)uVar2) {
          uVar4 = 0;
        }
        if (im->open[uVar4] != 0) {
          im->open[uVar4] = 0;
        }
        gdImageSetPixel(im,x,iVar1,(int)uVar4);
        x = x + 1;
        if (x == iStack_1018c) {
          if (iStack_10190 == 0) {
            iVar1 = iVar1 + 1;
            x = 0;
          }
          else {
            if (uVar5 < 2) {
              iVar1 = iVar1 + 8;
            }
            else if (uVar5 == 2) {
              iVar1 = iVar1 + 4;
            }
            else if (uVar5 == 3) {
              iVar1 = iVar1 + 2;
            }
            x = 0;
            if (height <= iVar1) {
              if (2 < uVar5) break;
              iVar1 = (&DAT_00125d54)[uVar5];
              uVar5 = uVar5 + 1;
            }
          }
        }
      } while (iVar1 < height);
      LWZReadByte(fd,&LStack_10188,'\0',(uint)bStack_10191,ZeroDataBlockP);
    }
  }
  return;
}

Assistant:

static void
ReadImage(gdImagePtr im, gdIOCtx *fd, int len, int height, unsigned char (*cmap)[256], int interlace, int *ZeroDataBlockP) /*1.4//, int ignore) */
{
	unsigned char c;
	int xpos = 0, ypos = 0, pass = 0;
	int v, i;
	LZW_STATIC_DATA sd;

	/* Initialize the Compression routines */
	if(!ReadOK(fd, &c, 1)) {
		return;
	}

	if(c > MAX_LWZ_BITS) {
		return;
	}

	/* Stash the color map into the image */
	for(i=0; (i < gdMaxColors); i++) {
		im->red[i] = cmap[CM_RED][i];
		im->green[i] = cmap[CM_GREEN][i];
		im->blue[i] = cmap[CM_BLUE][i];
		im->open[i] = 1;
	}

	/* Many (perhaps most) of these colors will remain marked open. */
	im->colorsTotal = gdMaxColors;
	if(LWZReadByte(fd, &sd, TRUE, c, ZeroDataBlockP) < 0) {
		return;
	}

	/*
	**  If this is an "uninteresting picture" ignore it.
	**  REMOVED For 1.4
	*/
	/*if (ignore) { */
	/*        while (LWZReadByte(fd, &sd, FALSE, c) >= 0) */
	/*                ; */
	/*        return; */
	/*} */

	while((v = LWZReadByte(fd, &sd, FALSE, c, ZeroDataBlockP)) >= 0 ) {
		if(v >= gdMaxColors) {
			v = 0;
		}

		/* This how we recognize which colors are actually used. */
		if(im->open[v]) {
			im->open[v] = 0;
		}

		gdImageSetPixel(im, xpos, ypos, v);

		++xpos;
		if(xpos == len) {
			xpos = 0;
			if(interlace) {
				switch (pass) {
				case 0:
				case 1:
					ypos += 8;
					break;
				case 2:
					ypos += 4;
					break;
				case 3:
					ypos += 2;
					break;
				}

				if(ypos >= height) {
					++pass;
					switch (pass) {
					case 1:
						ypos = 4;
						break;
					case 2:
						ypos = 2;
						break;
					case 3:
						ypos = 1;
						break;
					default:
						goto fini;
					}
				}
			} else {
				++ypos;
			}
		}

		if(ypos >= height) {
			break;
		}
	}

fini:
	if(LWZReadByte(fd, &sd, FALSE, c, ZeroDataBlockP) >=0) {
		/* Ignore extra */
	}
}